

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O0

int FBX::getProperty<int>(Node *node,string *property,int *fallback)

{
  bool bVar1;
  __type _Var2;
  reference pvVar3;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *this;
  reference pNVar4;
  const_reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int *piVar6;
  Node *prop;
  const_iterator __end2;
  const_iterator __begin2;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range2;
  allocator<char> local_c1;
  string local_c0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_a0;
  undefined1 local_88 [8];
  Node properties;
  int *fallback_local;
  string *property_local;
  Node *node_local;
  
  properties.properties.
  super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fallback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Properties70",&local_c1);
  findNodes(&local_a0,node,&local_c0);
  pvVar3 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator[](&local_a0,0);
  Node::Node((Node *)local_88,pvVar3);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  this = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)((long)&properties.id.field_2 + 8);
  __end2 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin(this);
  prop = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end(this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                                *)&prop);
    if (!bVar1) {
      node_local._4_4_ =
           *(int *)&((properties.properties.
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                    ).
                    super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                    .
                    super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                    .
                    super__Move_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                    .
                    super__Copy_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                    .
                    super__Variant_storage_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                    ._M_u;
LAB_00125fd5:
      Node::~Node((Node *)local_88);
      return node_local._4_4_;
    }
    pNVar4 = __gnu_cxx::
             __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
             ::operator*(&__end2);
    pvVar5 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&pNVar4->properties,0);
    __lhs = std::
            get<std::__cxx11::string,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                      (pvVar5);
    _Var2 = std::operator==(__lhs,property);
    if (_Var2) {
      pvVar5 = std::
               vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar4->properties,4);
      piVar6 = std::
               get<int,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         (pvVar5);
      node_local._4_4_ = *piVar6;
      goto LAB_00125fd5;
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

static T getProperty(const Node &node, const std::string &property, const T &fallback) {
        const Node properties = findNodes(node, "Properties70")[0];

        for (const auto &prop : properties.children)
            if (std::get<std::string>(prop.properties[0]) == property)
                return std::get<T>(prop.properties[4]);
        return fallback;
    }